

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

void BinaryenSelectSetCondition(BinaryenExpressionRef expr,BinaryenExpressionRef condExpr)

{
  if (expr->_id != SelectId) {
    __assert_fail("expression->is<Select>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0xb77,
                  "void BinaryenSelectSetCondition(BinaryenExpressionRef, BinaryenExpressionRef)");
  }
  if (condExpr != (BinaryenExpressionRef)0x0) {
    *(BinaryenExpressionRef *)(expr + 2) = condExpr;
    return;
  }
  __assert_fail("condExpr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0xb78,
                "void BinaryenSelectSetCondition(BinaryenExpressionRef, BinaryenExpressionRef)");
}

Assistant:

void BinaryenSelectSetCondition(BinaryenExpressionRef expr,
                                BinaryenExpressionRef condExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<Select>());
  assert(condExpr);
  static_cast<Select*>(expression)->condition = (Expression*)condExpr;
}